

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O3

void __thiscall
SkylineBinPack::AddWasteMapArea
          (SkylineBinPack *this,int skylineNodeIndex,int width,int height,int y)

{
  uint *puVar1;
  Rect *pRVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  SkylineNode *pSVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  Rect waste;
  Rect local_48;
  DisjointRectCollection *local_38;
  
  if (skylineNodeIndex < (int)(this->skyLine).Count) {
    lVar10 = (long)skylineNodeIndex;
    iVar3 = (this->skyLine).Array[lVar10].x;
    iVar9 = width + iVar3;
    local_38 = &this->disjointRects;
    lVar11 = lVar10 * 0xc + 8;
    do {
      pSVar6 = (this->skyLine).Array;
      iVar4 = *(int *)((long)pSVar6 + lVar11 + -8);
      if (iVar9 <= iVar4) {
        return;
      }
      iVar8 = *(int *)((long)&pSVar6->x + lVar11) + iVar4;
      if (iVar8 <= iVar3) {
        return;
      }
      iVar5 = *(int *)((long)pSVar6 + lVar11 + -4);
      if (y < iVar5) {
        __assert_fail("y >= skyLine[skylineNodeIndex].y",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                      ,0xbd,"void SkylineBinPack::AddWasteMapArea(int, int, int, int)");
      }
      if (iVar9 < iVar8) {
        iVar8 = iVar9;
      }
      local_48.width = iVar8 - iVar4;
      local_48.x = iVar4;
      local_48.y = iVar5;
      local_48.height = y - iVar5;
      bVar7 = DisjointRectCollection::Disjoint(local_38,&local_48);
      if (!bVar7) {
        __assert_fail("disjointRects.Disjoint(waste)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                      ,0xc6,"void SkylineBinPack::AddWasteMapArea(int, int, int, int)");
      }
      TArray<Rect,_Rect>::Grow(&(this->wasteMap).freeRectangles,1);
      pRVar2 = (this->wasteMap).freeRectangles.Array + (this->wasteMap).freeRectangles.Count;
      pRVar2->x = local_48.x;
      pRVar2->y = local_48.y;
      pRVar2->width = local_48.width;
      pRVar2->height = local_48.height;
      puVar1 = &(this->wasteMap).freeRectangles.Count;
      *puVar1 = *puVar1 + 1;
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 0xc;
    } while (lVar10 < (int)(this->skyLine).Count);
  }
  return;
}

Assistant:

void SkylineBinPack::AddWasteMapArea(int skylineNodeIndex, int width, int height, int y)
{
	int wastedArea = 0;
	const int rectLeft = skyLine[skylineNodeIndex].x;
	const int rectRight = rectLeft + width;
	for(; skylineNodeIndex < (int)skyLine.Size() && skyLine[skylineNodeIndex].x < rectRight; ++skylineNodeIndex)
	{
		if (skyLine[skylineNodeIndex].x >= rectRight || skyLine[skylineNodeIndex].x + skyLine[skylineNodeIndex].width <= rectLeft)
			break;

		int leftSide = skyLine[skylineNodeIndex].x;
		int rightSide = MIN(rectRight, leftSide + skyLine[skylineNodeIndex].width);
		assert(y >= skyLine[skylineNodeIndex].y);

		Rect waste;
		waste.x = leftSide;
		waste.y = skyLine[skylineNodeIndex].y;
		waste.width = rightSide - leftSide;
		waste.height = y - skyLine[skylineNodeIndex].y;

#ifdef _DEBUG
		assert(disjointRects.Disjoint(waste));
#endif
		wasteMap.GetFreeRectangles().Push(waste);
	}
}